

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

Animation * rw::Animation::streamReadLegacy(Stream *stream)

{
  void *pvVar1;
  int32 iVar2;
  int32 flags_00;
  AnimInterpolatorInfo *interpInfo_00;
  Animation *pAVar3;
  float32 fVar4;
  double __z;
  double dVar5;
  undefined8 in_XMM1_Qa;
  int32 prev;
  int local_3c;
  int32 i;
  HAnimKeyFrame *frames;
  float duration;
  int32 flags;
  int32 numFrames;
  AnimInterpolatorInfo *interpInfo;
  Animation *anim;
  Stream *stream_local;
  
  interpInfo_00 = AnimInterpolatorInfo::find(1);
  iVar2 = Stream::readI32(stream);
  flags_00 = Stream::readI32(stream);
  fVar4 = Stream::readF32(stream);
  pAVar3 = create(interpInfo_00,iVar2,flags_00,(float)fVar4);
  pvVar1 = pAVar3->keyframes;
  for (local_3c = 0; local_3c < pAVar3->numFrames; local_3c = local_3c + 1) {
    Stream::read32(stream,(void *)((long)pvVar1 + (long)local_3c * 0x28 + 0xc),0x10);
    dVar5 = conj(__z);
    *(double *)((long)pvVar1 + (long)local_3c * 0x28 + 0xc) = dVar5;
    *(undefined8 *)((long)pvVar1 + (long)local_3c * 0x28 + 0x14) = in_XMM1_Qa;
    Stream::read32(stream,(void *)((long)pvVar1 + (long)local_3c * 0x28 + 0x1c),0xc);
    fVar4 = Stream::readF32(stream);
    *(float32 *)((long)pvVar1 + (long)local_3c * 0x28 + 8) = fVar4;
    iVar2 = Stream::readI32(stream);
    *(void **)((long)pvVar1 + (long)local_3c * 0x28) =
         (void *)((long)pvVar1 + (long)(iVar2 / 0x24) * 0x28);
  }
  return pAVar3;
}

Assistant:

Animation*
Animation::streamReadLegacy(Stream *stream)
{
	Animation *anim;
	AnimInterpolatorInfo *interpInfo = AnimInterpolatorInfo::find(1);
	int32 numFrames = stream->readI32();
	int32 flags = stream->readI32();
	float duration = stream->readF32();
	anim = Animation::create(interpInfo, numFrames, flags, duration);
	HAnimKeyFrame *frames = (HAnimKeyFrame*)anim->keyframes;
	for(int32 i = 0; i < anim->numFrames; i++){
		stream->read32(&frames[i].q, 4*4);
		frames[i].q = conj(frames[i].q);
		stream->read32(&frames[i].t, 3*4);
		frames[i].time = stream->readF32();
		int32 prev = stream->readI32()/0x24;
		frames[i].prev = &frames[prev];
	}
	return anim;
}